

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btBvhSubtreeInfo>::resize
          (btAlignedObjectArray<btBvhSubtreeInfo> *this,int newsize,btBvhSubtreeInfo *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  btBvhSubtreeInfo *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  
  iVar2 = this->m_size;
  lVar8 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar7 = lVar8 << 5;
    for (; lVar8 < newsize; lVar8 = lVar8 + 1) {
      pbVar3 = this->m_data;
      uVar4 = *(undefined8 *)fillData;
      uVar5 = *(undefined8 *)(fillData->m_quantizedAabbMax + 1);
      uVar6 = *(undefined8 *)(fillData->m_padding + 1);
      puVar1 = (undefined8 *)((long)pbVar3->m_padding + lVar7 + -4);
      *puVar1 = *(undefined8 *)&fillData->m_subtreeSize;
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)pbVar3->m_quantizedAabbMin + lVar7);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar7 = lVar7 + 0x20;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}